

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar1;
  char cVar2;
  ImGuiTableColumnIdx IVar3;
  long lVar4;
  ImGuiTableColumn *pIVar5;
  byte bVar6;
  char cVar7;
  long lVar8;
  
  table = GImGui->CurrentTable;
  if ((table->Flags & 0x8000000U) == 0 && sort_direction == 0) {
    __assert_fail("sort_direction != ImGuiSortDirection_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0xa74,"void ImGui::TableSetColumnSortDirection(int, ImGuiSortDirection, bool)");
  }
  bVar6 = (byte)((uint)table->Flags >> 0x1a) & append_to_sort_specs;
  if (bVar6 == 0) {
    IVar3 = '\0';
  }
  else {
    lVar4 = (long)table->ColumnsCount;
    if (lVar4 < 1) {
      IVar3 = '\x01';
    }
    else {
      pIVar5 = (table->Columns).Data;
      cVar2 = '\0';
      do {
        if ((table->Columns).DataEnd <= pIVar5) goto LAB_001993bf;
        cVar7 = pIVar5->SortOrder;
        if (pIVar5->SortOrder < cVar2) {
          cVar7 = cVar2;
        }
        pIVar5 = pIVar5 + 1;
        lVar4 = lVar4 + -1;
        cVar2 = cVar7;
      } while (lVar4 != 0);
      IVar3 = cVar7 + '\x01';
    }
  }
  if ((column_n < 0) ||
     (pIVar5 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar5)) {
LAB_001993bf:
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_internal.h"
                  ,0x255,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
  }
  pIVar5->field_0x65 = pIVar5->field_0x65 & 0xfc | (byte)sort_direction & 3;
  if ((sort_direction & 3U) == 0) {
    IVar3 = -1;
  }
  else if ((bVar6 & pIVar5->SortOrder != -1) != 0) goto LAB_00199365;
  pIVar5->SortOrder = IVar3;
LAB_00199365:
  if (0 < table->ColumnsCount) {
    lVar8 = 0;
    lVar4 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      column = (ImGuiTableColumn *)((long)&pIVar1->Flags + lVar8);
      if ((table->Columns).DataEnd <= column) goto LAB_001993bf;
      if (column != pIVar5 && bVar6 == 0) {
        (&pIVar1->SortOrder)[lVar8] = -1;
      }
      TableFixColumnSortDirection(table,column);
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + 0x68;
    } while (lVar4 < table->ColumnsCount);
  }
  table->IsSettingsDirty = true;
  table->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}